

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O2

void __thiscall BmsNoteManager::SRandom(BmsNoteManager *this,uint seed,int s,int e)

{
  int iVar1;
  _Rb_tree_color bar;
  bool bVar2;
  int iVar3;
  BmsNote *pBVar4;
  _Base_ptr p_Var5;
  long lVar6;
  long lVar7;
  BmsNoteLane *this_00;
  int iVar8;
  long lVar9;
  int c_1;
  long lVar10;
  bool iscurrent [20];
  bool isln [20];
  BmsNote currentnote;
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  BmsNote currentrow [20];
  
  srand(seed);
  notemap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &notemap._M_t._M_impl.super__Rb_tree_header._M_header;
  notemap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  notemap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  notemap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  notemap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       notemap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetNoteExistBar(this,&notemap);
  lVar10 = (long)e;
  isln[0x10] = false;
  isln[0x11] = false;
  isln[0x12] = false;
  isln[0x13] = false;
  isln[0] = false;
  isln[1] = false;
  isln[2] = false;
  isln[3] = false;
  isln[4] = false;
  isln[5] = false;
  isln[6] = false;
  isln[7] = false;
  isln[8] = false;
  isln[9] = false;
  isln[10] = false;
  isln[0xb] = false;
  isln[0xc] = false;
  isln[0xd] = false;
  isln[0xe] = false;
  isln[0xf] = false;
  lVar6 = (long)s;
  p_Var5 = notemap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == &notemap._M_t._M_impl.super__Rb_tree_header) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&notemap._M_t);
      return;
    }
    bar = p_Var5[1]._M_color;
    iscurrent[0] = false;
    iscurrent[1] = false;
    iscurrent[2] = false;
    iscurrent[3] = false;
    iscurrent[4] = false;
    iscurrent[5] = false;
    iscurrent[6] = false;
    iscurrent[7] = false;
    iscurrent[8] = false;
    iscurrent[9] = false;
    iscurrent[10] = false;
    iscurrent[0xb] = false;
    iscurrent[0xc] = false;
    iscurrent[0xd] = false;
    iscurrent[0xe] = false;
    iscurrent[0xf] = false;
    iscurrent[0x10] = false;
    iscurrent[0x11] = false;
    iscurrent[0x12] = false;
    iscurrent[0x13] = false;
    lVar9 = 0;
    do {
      BmsNote::BmsNote((BmsNote *)((long)&currentrow[0].type + lVar9));
      lVar9 = lVar9 + 0x20;
      pBVar4 = currentrow + lVar6;
      lVar7 = lVar6;
    } while (lVar9 != 0x280);
    for (; lVar9 = lVar6, lVar7 <= lVar10; lVar7 = lVar7 + 1) {
      pBVar4->type = 0;
      pBVar4 = pBVar4 + 1;
    }
    for (; this_00 = this->lanes_ + lVar6, pBVar4 = currentrow + lVar6, lVar7 = lVar6,
        lVar9 <= lVar10; lVar9 = lVar9 + 1) {
      BmsNoteLane::Get(&currentnote,this->lanes_ + lVar9,bar);
      if (currentnote.type != 0) {
        iVar3 = rand();
        iVar8 = -1;
        while( true ) {
          iVar3 = iVar3 % ((e - s) + 1);
          iVar1 = iVar3 + s;
          if ((isln[iVar1] == false) && (iscurrent[iVar1] != true)) break;
          iVar3 = iVar3 + 1;
          iVar8 = iVar8 + 1;
          if (e - s < iVar8) {
            __assert_fail("attempt <= keycount",
                          "/workspace/llm4binary/github/license_c_cmakelists/kuna[P]bmsbelplus/bmsbel/bms_note.cpp"
                          ,0x11b,"void BmsNoteManager::SRandom(unsigned int, int, int)");
          }
        }
        *(ulong *)&currentrow[iVar1].field_0xc = CONCAT44(currentnote.pos._0_4_,currentnote._12_4_);
        *(undefined8 *)((long)&currentrow[iVar1].pos + 4) = currentnote._20_8_;
        currentrow[iVar1].type = currentnote.type;
        currentrow[iVar1].value = (BmsWord)currentnote.value.value_;
        *(ulong *)&currentrow[iVar1].time = CONCAT44(currentnote._12_4_,currentnote.time);
        if (currentnote.type == 2) {
          bVar2 = true;
LAB_0012e568:
          isln[iVar1] = bVar2;
        }
        else if (currentnote.type == 3) {
          bVar2 = false;
          goto LAB_0012e568;
        }
        iscurrent[iVar1] = true;
      }
      BmsWord::~BmsWord(&currentnote.value);
    }
    for (; lVar7 <= lVar10; lVar7 = lVar7 + 1) {
      BmsNoteLane::Delete(this_00,bar);
      if (pBVar4->type != 0) {
        BmsNoteLane::Set(this_00,bar,pBVar4);
      }
      this_00 = this_00 + 1;
      pBVar4 = pBVar4 + 1;
    }
    lVar9 = 0x264;
    do {
      BmsWord::~BmsWord((BmsWord *)((long)&currentrow[0].type + lVar9));
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != -0x1c);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void BmsNoteManager::SRandom(unsigned int seed, int s, int e) {
	// similar to HRandom
	// prepare
	srand(seed);
	int keycount = e - s + 1;
	int failure = 0;			// failed notecount to randomize
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	// start to iterate all bars
	bool isprev[_MAX_NOTE_LANE] = { false, };	// is there any note placed previously?
	bool isln[_MAX_NOTE_LANE] = { false, };		// is there occupying longnote currently?
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex row = *it;
		bool iscurrent[_MAX_NOTE_LANE] = { false, };
		BmsNote currentrow[_MAX_NOTE_LANE];
		int attempt = 0;
		// initalize row data
		for (int c = s; c <= e; c++) {
			currentrow[c].type = BmsNote::NOTE_NONE;
		}
		// make new row data
		for (int c = s; c <= e; c++) {
			attempt = 0;
			// check previous note data to check valid
			BmsNote currentnote = lanes_[c].Get(row);
			if (currentnote.type == BmsNote::NOTE_NONE) continue;

			/*
			 * find new lane to place note
			 * only difference(from HRANDOM) is here:
			 * we don't check isprev[] (is previously note existed?)
			 */
			int newlane = rand() % keycount + s;
			while (isln[newlane] || iscurrent[newlane]) {
				newlane = (newlane - s + 1) % keycount + s;
				attempt++;
				_ASSERT(attempt <= keycount);	// this shouldn't happen
			}
			// copy previous note data to new temp row
			currentrow[newlane] = currentnote;
			switch (currentnote.type) {
			case BmsNote::NOTE_LNSTART:
				isln[newlane] = true;
				break;
			case BmsNote::NOTE_LNEND:
				isln[newlane] = false;
				break;
			}
			iscurrent[newlane] = true;
		}
		// copy
		for (int c = s; c <= e; c++) {
			lanes_[c].Delete(row);
			if (currentrow[c].type != BmsNote::NOTE_NONE) 
				lanes_[c].Set(row, currentrow[c]);
		}
		memcpy(isprev, iscurrent, sizeof(isprev));
	}
}